

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O1

void __thiscall npas4_AllocPhysical_Test::TestBody(npas4_AllocPhysical_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  AssertHelper AVar3;
  long lVar4;
  char *pcVar5;
  int64_t startUsedByCurrentProcess;
  AssertionResult gtest_ar;
  int64_t startTotal;
  char *in_stack_ffffffffffffffb8;
  AssertHelper local_38;
  internal in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  long local_18;
  
  local_18 = npas4::GetRAMPhysicalTotal();
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               npas4::GetRAMSystemTotal();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemTotal()","int64_t(1024)",
             (long *)&stack0xffffffffffffffd0,(long *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x5c,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (((sVar2.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (sVar2.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar2.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               npas4::GetRAMSystemTotal();
  npas4::GetRAMSystemAvailable();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemTotal()",
             "npas4::GetRAMSystemAvailable()",(long *)&stack0xffffffffffffffd0,
             (long *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (((sVar2.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (sVar2.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar2.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               npas4::GetRAMSystemTotal();
  npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemTotal()",
             "npas4::GetRAMSystemUsed()",(long *)&stack0xffffffffffffffd0,
             (long *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (((sVar2.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (sVar2.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar2.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               npas4::GetRAMSystemAvailable();
  npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemAvailable()",
             "npas4::GetRAMSystemUsed()",(long *)&stack0xffffffffffffffd0,
             (long *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (((sVar2.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (sVar2.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar2.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               npas4::GetRAMPhysicalUsedByCurrentProcess();
  AVar3.data_ = (AssertHelperData *)npas4::GetRAMSystemTotal();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemTotal()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x62,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (((AVar3.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (AVar3.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)AVar3.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar3.data_ = (AssertHelperData *)npas4::GetRAMSystemAvailable();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemAvailable()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (((AVar3.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (AVar3.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)AVar3.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar3.data_ = (AssertHelperData *)npas4::GetRAMSystemUsed();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMSystemUsed()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (in_stack_ffffffffffffffd8 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (((AVar3.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (AVar3.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)AVar3.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar4 = std::chrono::_V2::system_clock::now();
  if (lVar4 == 0) {
    AVar3.data_ = (AssertHelperData *)npas4::GetRAMPhysicalTotal();
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&stack0xffffffffffffffd8,"startTotal","npas4::GetRAMPhysicalTotal()",
               &local_18,(long *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8 == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      if (in_stack_ffffffffffffffe0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x6d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((AVar3.data_ != (AssertHelperData *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (AVar3.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)AVar3.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffe0,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar3.data_ = (AssertHelperData *)npas4::GetRAMPhysicalUsedByCurrentProcess();
    testing::internal::CmpHelperNE<long,long>
              ((internal *)&stack0xffffffffffffffd8,"startUsedByCurrentProcess",
               "npas4::GetRAMPhysicalUsedByCurrentProcess()",(long *)&stack0xffffffffffffffd0,
               (long *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8 == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      if (in_stack_ffffffffffffffe0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x6e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((AVar3.data_ != (AssertHelperData *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (AVar3.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)AVar3.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffe0,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar3.data_ = (AssertHelperData *)((long)DWORD_ARRAY_00100fac + (long)(sVar2.ptr_ + 0x54));
    local_38.data_ = (AssertHelperData *)npas4::GetRAMPhysicalUsedByCurrentProcess();
    testing::internal::CmpHelperLT<long,long>
              ((internal *)&stack0xffffffffffffffd8,"startUsedByCurrentProcess + allocAmmount",
               "npas4::GetRAMPhysicalUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
               (long *)&local_38);
    if (in_stack_ffffffffffffffd8 == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(AVar3.data_)->line,
                 "We did an allocation, but are using less RAM. Start: ",0x35);
      std::ostream::_M_insert<long>((long)&(AVar3.data_)->line);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(AVar3.data_)->line,", Alloc: ",9);
      std::ostream::_M_insert<long>((long)&(AVar3.data_)->line);
      if (in_stack_ffffffffffffffe0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x70,pcVar5);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((AVar3.data_ != (AssertHelperData *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (AVar3.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)AVar3.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffe0,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar3.data_ = (AssertHelperData *)npas4::GetRAMPhysicalUsedByCurrentProcess();
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&stack0xffffffffffffffd8,"npas4::GetRAMPhysicalUsedByCurrentProcess()",
               "startUsedByCurrentProcess",(long *)&stack0xffffffffffffffc0,
               (long *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffd8 == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      if (in_stack_ffffffffffffffe0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x74,pcVar5);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((AVar3.data_ != (AssertHelperData *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (AVar3.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)AVar3.data_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffe0,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffe0,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      npas4::GetRAMPhysicalUsedByCurrentProcess();
      npas4::GetRAMPhysicalUsedByCurrentProcess();
      testing::internal::DoubleNearPredFormat
                ((char *)AVar3.data_,in_stack_ffffffffffffffb8,(char *)0x11bf04,
                 (double)in_stack_ffffffffffffffe0.ptr_,
                 (double)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
                 (double)sVar2.ptr_);
      if (in_stack_ffffffffffffffd8 == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffc0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar3.data_)->line,"Memory Delta: ",0xe);
        std::ostream::_M_insert<long>((long)&(AVar3.data_)->line);
        if (in_stack_ffffffffffffffe0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                   ,0x77,pcVar5);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (((AVar3.data_ != (AssertHelperData *)0x0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           (AVar3.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)AVar3.data_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffe0,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(npas4, AllocPhysical)
{
	const auto startTotal = npas4::GetRAMPhysicalTotal();
	EXPECT_GT(npas4::GetRAMSystemTotal(), int64_t(1024));
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemAvailable());
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsed());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsed());

	const auto startUsedByCurrentProcess = npas4::GetRAMPhysicalUsedByCurrentProcess();
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemUsed(), npas4::GetRAMSystemUsedByCurrentProcess());

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		EXPECT_EQ(startTotal, npas4::GetRAMPhysicalTotal());
		EXPECT_NE(startUsedByCurrentProcess, npas4::GetRAMPhysicalUsedByCurrentProcess());

		EXPECT_LT(startUsedByCurrentProcess + allocAmmount, npas4::GetRAMPhysicalUsedByCurrentProcess())
			<< "We did an allocation, but are using less RAM. Start: " << startUsedByCurrentProcess << ", Alloc: " << allocAmmount;

		// Assume we are not swapping out to disk
		ASSERT_GT(npas4::GetRAMPhysicalUsedByCurrentProcess(), startUsedByCurrentProcess);

		const auto memoryDelta = npas4::GetRAMPhysicalUsedByCurrentProcess() - startUsedByCurrentProcess;
		EXPECT_NEAR(npas4::GetRAMPhysicalUsedByCurrentProcess() - startUsedByCurrentProcess, memoryDelta, 4096) << "Memory Delta: " << memoryDelta;
		delete[] megabyte;
	}
}